

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void duckdb_parquet::swap(FileMetaData *a,FileMetaData *b)

{
  _EncryptionAlgorithm__isset _Var1;
  _FileMetaData__isset _Var2;
  int32_t iVar3;
  int64_t iVar4;
  vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_> local_68;
  vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_> local_48;
  
  iVar3 = a->version;
  a->version = b->version;
  b->version = iVar3;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(a->schema).
                super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                .
                super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(a->schema).
                super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                .
                super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(a->schema).
                super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                .
                super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->schema).
  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->schema).
  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->schema).
  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
  _M_move_assign(&(a->schema).
                  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                 ,&b->schema);
  local_48.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(b->schema).
                super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                .
                super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(b->schema).
                super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                .
                super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(b->schema).
                super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                .
                super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->schema).
  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)local_68.
                super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (b->schema).
  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_68.
                super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (b->schema).
  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_68.
                super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
  ~vector((vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_> *)
          &local_48);
  std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
  ~vector((vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_> *)
          &local_68);
  iVar4 = a->num_rows;
  a->num_rows = b->num_rows;
  b->num_rows = iVar4;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(a->row_groups).
                super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
                super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(a->row_groups).
                super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
                super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(a->row_groups).
                super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
                super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->row_groups).super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->row_groups).super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (a->row_groups).super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>::_M_move_assign
            (&(a->row_groups).
              super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>,
             &b->row_groups);
  local_48.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(b->row_groups).
                super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
                super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(b->row_groups).
                super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
                super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(b->row_groups).
                super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
                super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->row_groups).super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_68.
                super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (b->row_groups).super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_68.
                super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (b->row_groups).super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_68.
                super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>::~vector
            ((vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_> *)
             &local_48);
  std::vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>::~vector
            ((vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_> *)
             &local_68);
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(a->key_value_metadata).
                super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
                super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(a->key_value_metadata).
                super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
                super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(a->key_value_metadata).
                super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
                super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (a->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::_M_move_assign
            (&(a->key_value_metadata).
              super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>,
             &b->key_value_metadata);
  local_48.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(b->key_value_metadata).
                super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
                super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(b->key_value_metadata).
                super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
                super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(b->key_value_metadata).
                super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
                super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_68.
                super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (b->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_68.
                super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (b->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_68.
                super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::~vector
            ((vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_> *)
             &local_48);
  std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::~vector
            ((vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_> *)
             &local_68);
  std::__cxx11::string::swap((string *)&a->created_by);
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (a->column_orders).
       super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
       super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (a->column_orders).
       super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
       super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (a->column_orders).
       super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
       super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->column_orders).
  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->column_orders).
  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->column_orders).
  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>::
  _M_move_assign(&(a->column_orders).
                  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                 ,&b->column_orders);
  local_48.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (b->column_orders).
       super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
       super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (b->column_orders).
       super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
       super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->column_orders).
       super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
       super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->column_orders).
  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (b->column_orders).
  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (b->column_orders).
  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>::~vector
            (&local_48);
  std::vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>::~vector
            (&local_68);
  swap(&(a->encryption_algorithm).AES_GCM_V1,&(b->encryption_algorithm).AES_GCM_V1);
  swap(&(a->encryption_algorithm).AES_GCM_CTR_V1,&(b->encryption_algorithm).AES_GCM_CTR_V1);
  _Var1 = (a->encryption_algorithm).__isset;
  (a->encryption_algorithm).__isset = (b->encryption_algorithm).__isset;
  (b->encryption_algorithm).__isset = _Var1;
  std::__cxx11::string::swap((string *)&a->footer_signing_key_metadata);
  _Var2 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var2;
  return;
}

Assistant:

void swap(FileMetaData &a, FileMetaData &b) {
  using ::std::swap;
  swap(a.version, b.version);
  swap(a.schema, b.schema);
  swap(a.num_rows, b.num_rows);
  swap(a.row_groups, b.row_groups);
  swap(a.key_value_metadata, b.key_value_metadata);
  swap(a.created_by, b.created_by);
  swap(a.column_orders, b.column_orders);
  swap(a.encryption_algorithm, b.encryption_algorithm);
  swap(a.footer_signing_key_metadata, b.footer_signing_key_metadata);
  swap(a.__isset, b.__isset);
}